

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateType.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::AggregateType::operator==(AggregateType *this,AggregateType *Value)

{
  long lVar1;
  long lVar2;
  
  lVar1._0_1_ = this->m_ui8Kind;
  lVar1._1_1_ = this->m_ui8Domain;
  lVar1._2_2_ = this->m_ui16Country;
  lVar1._4_1_ = this->m_ui8Category;
  lVar1._5_1_ = this->m_ui8SubCategory;
  lVar1._6_1_ = this->m_ui8Specific;
  lVar1._7_1_ = this->m_ui8Extra;
  lVar2._0_1_ = Value->m_ui8Kind;
  lVar2._1_1_ = Value->m_ui8Domain;
  lVar2._2_2_ = Value->m_ui16Country;
  lVar2._4_1_ = Value->m_ui8Category;
  lVar2._5_1_ = Value->m_ui8SubCategory;
  lVar2._6_1_ = Value->m_ui8Specific;
  lVar2._7_1_ = Value->m_ui8Extra;
  return lVar1 == lVar2;
}

Assistant:

KBOOL AggregateType::operator == ( const AggregateType & Value ) const
{
    if( m_ui8Kind           != Value.m_ui8Kind )        return false;
    if( m_ui8Domain         != Value.m_ui8Domain )      return false;
    if( m_ui16Country       != Value.m_ui16Country )    return false;
    if( m_ui8Category       != Value.m_ui8Category )    return false;
    if( m_ui8SubCategory    != Value.m_ui8SubCategory ) return false;
    if( m_ui8Specific       != Value.m_ui8Specific )    return false;
    if( m_ui8Extra          != Value.m_ui8Extra )       return false;
    return true;
}